

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoBinop<int,int>(Thread *this,BinopTrapFunc<int,_int> *f,Ptr *out_trap)

{
  int iVar1;
  int iVar2;
  RunResult RVar3;
  int out;
  string msg;
  int local_4c;
  string local_48;
  
  iVar1 = Pop<int>(this);
  iVar2 = Pop<int>(this);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  RVar3 = (*f)(iVar2,iVar1,&local_4c,&local_48);
  if (RVar3 == Trap) {
    DoBinop<int,int>();
    RVar3 = Trap;
  }
  else {
    Push<int>(this,local_4c);
    RVar3 = Ok;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}